

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Exaggerated_Animator_Abort_Do_proc(Am_Object *interp)

{
  Am_Slot_Key key;
  int iVar1;
  Am_Value *pAVar2;
  Am_Object local_20;
  
  pAVar2 = Am_Object::Get(interp,0x111,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(interp,0x108,0);
  Am_Object::Am_Object(&local_20,pAVar2);
  Am_Abort_Animator(&local_20);
  Am_Object::~Am_Object(&local_20);
  if (iVar1 == -1) {
    key = 0x181;
  }
  else {
    key = 0x182;
    if (iVar1 < 1) goto LAB_001968a5;
  }
  pAVar2 = Am_Object::Get(interp,key,0);
  Am_Object::Set(interp,0x169,pAVar2,0);
LAB_001968a5:
  Am_Object::Set(interp,0x111,-2,0);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Exaggerated_Animator_Abort_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Exaggerated Abort of " << interp);
  int state = interp.Get(Am_EXAGGERATOR_STATE);

  Am_Abort_Animator(interp.Get(Am_SUB_ANIMATOR));

  if (state == Am_EXAGGERATOR_WINDUP) {
    // in wind-up phase -- set back to original value
    interp.Set(Am_VALUE, interp.Get(Am_VALUE_1));
  } else if (state >= Am_EXAGGERATOR_WIGGLING) {
    // in wiggle phase -- set to final value
    interp.Set(Am_VALUE, interp.Get(Am_VALUE_2));
  }

  interp.Set(Am_EXAGGERATOR_STATE, Am_EXAGGERATOR_IDLE);
}